

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.hpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::~VaryingComponentsTest(VaryingComponentsTest *this)

{
  (this->super_VaryingLocationsTest).super_TextureTestBase.super_TestBase.super_TestCase.
  super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)&PTR__VaryingComponentsTest_01dbe840;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::
  _Vector_base<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
  ::~_Vector_base(&(this->m_test_cases).
                   super__Vector_base<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
                 );
  VaryingLocationsTest::~VaryingLocationsTest(&this->super_VaryingLocationsTest);
  return;
}

Assistant:

~VaryingComponentsTest()
	{
	}